

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbleed.c
# Opt level: O0

int dtls1_process_heartbeat_fixed(SSL *s)

{
  uchar uVar1;
  uchar uVar2;
  uchar *puVar3;
  uint uVar4;
  uint i;
  int iVar5;
  uchar *buf;
  uint seq;
  int r;
  uint write_length;
  uchar *bp;
  uchar *buffer;
  uint padding;
  uint payload;
  unsigned_short hbtype;
  uchar *pl;
  uchar *p;
  SSL *s_local;
  
  puVar3 = (s->s3->rrec).data;
  if (s->msg_callback != (_func_void_int_int_int_void_ptr_size_t_void_ptr_void_ptr *)0x0) {
    (*s->msg_callback)(0,s->version,0x18,(s->s3->rrec).data,(long)(s->s3->rrec).length,s,
                       s->msg_callback_arg);
  }
  if (0x12 < (s->s3->rrec).length) {
    uVar1 = puVar3[1];
    uVar2 = puVar3[2];
    uVar4 = (uint)CONCAT11(uVar1,uVar2);
    if (uVar4 + 0x13 <= (uint)(s->s3->rrec).length) {
      if (*puVar3 == '\x01') {
        i = uVar4 + 0x13;
        if (0x4000 < i) {
          return 0;
        }
        buf = OPENSSL_malloc(i);
        *buf = '\x02';
        buf[1] = uVar1;
        buf[2] = uVar2;
        memcpy(buf + 3,puVar3 + 3,(ulong)uVar4);
        RAND_pseudo_bytes(buf + 3 + uVar4,0x10);
        iVar5 = dtls1_write_bytes(s,0x18,buf,i);
        if ((-1 < iVar5) &&
           (s->msg_callback != (_func_void_int_int_int_void_ptr_size_t_void_ptr_void_ptr *)0x0)) {
          (*s->msg_callback)(1,s->version,0x18,buf,(size_t)i,s,s->msg_callback_arg);
        }
        OPENSSL_free(buf);
        if (iVar5 < 0) {
          return iVar5;
        }
      }
      else if (((*puVar3 == '\x02') && (uVar4 == 0x12)) &&
              ((uint)CONCAT11(puVar3[3],puVar3[4]) == s->tlsext_hb_seq)) {
        dtls1_stop_timer(s);
        s->tlsext_hb_seq = s->tlsext_hb_seq + 1;
        s->tlsext_hb_pending = 0;
      }
    }
  }
  return 0;
}

Assistant:

int
dtls1_process_heartbeat_fixed(SSL *s) {
  unsigned char *p = &s->s3->rrec.data[0], *pl;
  unsigned short hbtype;
  unsigned int payload;
  unsigned int padding = 16; /* Use minimum padding */

  if (s->msg_callback)
    s->msg_callback(0, s->version, TLS1_RT_HEARTBEAT,
                    &s->s3->rrec.data[0], s->s3->rrec.length,
                    s, s->msg_callback_arg);

  /* Read type and payload length first */
  if (1 + 2 + 16 > s->s3->rrec.length)
    return 0; /* silently discard */
  hbtype = *p++;
  n2s(p, payload);
  if (1 + 2 + payload + 16 > s->s3->rrec.length)
    return 0; /* silently discard per RFC 6520 sec. 4 */
  pl = p;

  if (hbtype == TLS1_HB_REQUEST) {
    unsigned char *buffer, *bp;
    unsigned int write_length = 1 /* heartbeat type */ +
                                2 /* heartbeat length */ +
                                payload + padding;
    int r;

    if (write_length > SSL3_RT_MAX_PLAIN_LENGTH)
      return 0;

    /* Allocate memory for the response, size is 1 byte
     * message type, plus 2 bytes payload length, plus
     * payload, plus padding
     */
    buffer = OPENSSL_malloc(write_length);
    bp = buffer;

    /* Enter response type, length and copy payload */
    *bp++ = TLS1_HB_RESPONSE;
    s2n(payload, bp);
    memcpy(bp, pl, payload);
    bp += payload;
    /* Random padding */
    RAND_pseudo_bytes(bp, padding);

    r = dtls1_write_bytes(s, TLS1_RT_HEARTBEAT, buffer, write_length);

    if (r >= 0 && s->msg_callback)
      s->msg_callback(1, s->version, TLS1_RT_HEARTBEAT,
                      buffer, write_length,
                      s, s->msg_callback_arg);

    OPENSSL_free(buffer);

    if (r < 0)
      return r;
  } else if (hbtype == TLS1_HB_RESPONSE) {
    unsigned int seq;

    /* We only send sequence numbers (2 bytes unsigned int),
     * and 16 random bytes, so we just try to read the
     * sequence number */
    n2s(pl, seq);

    if (payload == 18 && seq == s->tlsext_hb_seq) {
      dtls1_stop_timer(s);
      s->tlsext_hb_seq++;
      s->tlsext_hb_pending = 0;
    }
  }

  return 0;
}